

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_0::FillTest::testRender(FillTest *this)

{
  Vector<int,_4> *this_00;
  pointer ppSVar1;
  int depthBits;
  RenderContext *context;
  RenderTarget *pRVar2;
  PixelFormat *colorBits;
  MessageBuilder *pMVar3;
  TestLog *pTVar4;
  ConstPixelBufferAccess local_7400;
  allocator<char> local_73d1;
  string local_73d0;
  allocator<char> local_73a9;
  string local_73a8;
  LogImage local_7388;
  ConstPixelBufferAccess local_72f8;
  allocator<char> local_72c9;
  string local_72c8;
  allocator<char> local_72a1;
  string local_72a0;
  LogImage local_7280;
  ConstPixelBufferAccess local_71f0;
  allocator<char> local_71c1;
  string local_71c0;
  allocator<char> local_7199;
  string local_7198;
  LogImage local_7178;
  allocator<char> local_70e1;
  string local_70e0;
  allocator<char> local_70b9;
  string local_70b8;
  LogImageSet local_7098;
  MessageBuilder local_7058;
  PixelBufferAccess local_6ed8;
  ConstPixelBufferAccess local_6eb0;
  ConstPixelBufferAccess local_6e88;
  PixelBufferAccess local_6e60;
  ConstPixelBufferAccess local_6e38;
  MessageBuilder local_6e10;
  MessageBuilder local_6c90;
  int local_6b0c;
  undefined1 local_6b08 [4];
  int faultyPixels;
  Surface diffMask;
  int kernelRadius;
  allocator<char> local_6ab9;
  string local_6ab8;
  allocator<char> local_6a91;
  string local_6a90;
  LogImage local_6a70;
  ConstPixelBufferAccess local_69e0;
  allocator<char> local_69b1;
  string local_69b0;
  allocator<char> local_6989;
  string local_6988;
  LogImage local_6968;
  allocator<char> local_68d1;
  string local_68d0;
  allocator<char> local_68a9;
  string local_68a8;
  LogImageSet local_6888;
  MessageBuilder local_6848;
  PixelBufferAccess local_66c8;
  ConstPixelBufferAccess local_66a0;
  MessageBuilder local_6678;
  undefined1 local_64f8 [8];
  Surface outputImage;
  undefined1 local_64d8 [7];
  bool overdrawOk;
  Surface refSurface;
  Surface testSurface;
  MultisamplePixelBufferAccess local_6480;
  MultisamplePixelBufferAccess local_6458;
  undefined1 local_6430 [8];
  ReferenceContext refContext;
  ReferenceContextBuffers buffers;
  undefined1 local_1f8 [8];
  ReferenceContextLimits limits;
  undefined1 local_190 [8];
  GLContext glesContext;
  TestLog *log;
  int numSamples;
  FillTest *this_local;
  
  glesContext.m_programs.
  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)tcu::TestContext::getLog
                          ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode
                           .m_testCtx);
  context = Context::getRenderContext((this->super_RenderTestCase).super_TestCase.m_context);
  ppSVar1 = glesContext.m_programs.
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  this_00 = (Vector<int,_4> *)((long)&limits.extensionStr.field_2 + 8);
  tcu::Vector<int,_4>::Vector(this_00,0,0,200,200);
  sglr::GLContext::GLContext((GLContext *)local_190,context,(TestLog *)ppSVar1,0,this_00);
  sglr::ReferenceContextLimits::ReferenceContextLimits((ReferenceContextLimits *)local_1f8);
  pRVar2 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  colorBits = tcu::RenderTarget::getPixelFormat(pRVar2);
  pRVar2 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  depthBits = tcu::RenderTarget::getDepthBits(pRVar2);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,colorBits,depthBits,0,200,200,1);
  sglr::ReferenceContextBuffers::getColorbuffer
            (&local_6458,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextBuffers::getDepthbuffer
            (&local_6480,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)&testSurface.m_pixels.m_cap,
             (ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_6430,(ReferenceContextLimits *)local_1f8,&local_6458,
             &local_6480,(MultisamplePixelBufferAccess *)&testSurface.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)&refSurface.m_pixels.m_cap,200,200);
  tcu::Surface::Surface((Surface *)local_64d8,200,200);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,local_190);
  sglr::Context::readPixels((Context *)local_190,(Surface *)&refSurface.m_pixels.m_cap,0,0,200,200);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,local_6430);
  sglr::Context::readPixels((Context *)local_6430,(Surface *)local_64d8,0,0,200,200);
  tcu::Surface::Surface((Surface *)local_64f8,200,200);
  tcu::TestLog::operator<<
            (&local_6678,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar3 = tcu::MessageBuilder::operator<<(&local_6678,(char (*) [23])"Checking for overdraw ");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6678);
  ppSVar1 = glesContext.m_programs.
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pRVar2 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_66a0,(Surface *)&refSurface.m_pixels.m_cap);
  tcu::Surface::getAccess(&local_66c8,(Surface *)local_64f8);
  outputImage.m_pixels.m_cap._7_1_ =
       checkHalfFilledImageOverdraw((TestLog *)ppSVar1,pRVar2,&local_66a0,&local_66c8);
  ppSVar1 = glesContext.m_programs.
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (!(bool)outputImage.m_pixels.m_cap._7_1_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68a8,"Images",&local_68a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68d0,"Image comparison",&local_68d1);
    tcu::LogImageSet::LogImageSet(&local_6888,&local_68a8,&local_68d0);
    pTVar4 = tcu::TestLog::operator<<((TestLog *)ppSVar1,&local_6888);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6988,"TestImage",&local_6989);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_69b0,"Test image",&local_69b1);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_69e0,(Surface *)&refSurface.m_pixels.m_cap);
    tcu::LogImage::LogImage
              (&local_6968,&local_6988,&local_69b0,&local_69e0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_6968);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a90,"InvalidPixels",&local_6a91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6ab8,"Invalid pixels",&local_6ab9);
    tcu::Surface::getAccess((PixelBufferAccess *)&stack0xffffffffffff9518,(Surface *)local_64f8);
    tcu::LogImage::LogImage
              (&local_6a70,&local_6a90,&local_6ab8,
               (ConstPixelBufferAccess *)&stack0xffffffffffff9518,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_6a70);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::TestLog::operator<<(&local_6848,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_6848,(char (*) [14])"Got overdraw.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6848);
    tcu::LogImage::~LogImage(&local_6a70);
    std::__cxx11::string::~string((string *)&local_6ab8);
    std::allocator<char>::~allocator(&local_6ab9);
    std::__cxx11::string::~string((string *)&local_6a90);
    std::allocator<char>::~allocator(&local_6a91);
    tcu::LogImage::~LogImage(&local_6968);
    std::__cxx11::string::~string((string *)&local_69b0);
    std::allocator<char>::~allocator(&local_69b1);
    std::__cxx11::string::~string((string *)&local_6988);
    std::allocator<char>::~allocator(&local_6989);
    tcu::LogImageSet::~LogImageSet(&local_6888);
    std::__cxx11::string::~string((string *)&local_68d0);
    std::allocator<char>::~allocator(&local_68d1);
    std::__cxx11::string::~string((string *)&local_68a8);
    std::allocator<char>::~allocator(&local_68a9);
    tcu::TestContext::setTestResult
              ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Got overdraw");
  }
  tcu::Surface::~Surface((Surface *)local_64f8);
  diffMask.m_pixels.m_cap._4_4_ = 1;
  tcu::Surface::Surface((Surface *)local_6b08,200,200);
  tcu::TestLog::operator<<
            (&local_6c90,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar3 = tcu::MessageBuilder::operator<<(&local_6c90,(char (*) [21])"Comparing images... ");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6c90);
  tcu::TestLog::operator<<
            (&local_6e10,
             (TestLog *)
             glesContext.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar3 = tcu::MessageBuilder::operator<<(&local_6e10,(char (*) [28])"Deviation within radius of ")
  ;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&diffMask.m_pixels.m_cap + 4));
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" is allowed.");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6e10);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_6e38,(Surface *)local_64d8);
  tcu::Surface::getAccess(&local_6e60,(Surface *)local_64d8);
  blitImageOnBlackSurface(&local_6e38,&local_6e60);
  ppSVar1 = glesContext.m_programs.
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_6e88,(Surface *)&refSurface.m_pixels.m_cap);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_6eb0,(Surface *)local_64d8);
  tcu::Surface::getAccess(&local_6ed8,(Surface *)local_6b08);
  local_6b0c = compareBlackNonBlackImages((TestLog *)ppSVar1,&local_6e88,&local_6eb0,&local_6ed8,1);
  ppSVar1 = glesContext.m_programs.
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (0 < local_6b0c) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70b8,"Images",&local_70b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70e0,"Image comparison",&local_70e1);
    tcu::LogImageSet::LogImageSet(&local_7098,&local_70b8,&local_70e0);
    pTVar4 = tcu::TestLog::operator<<((TestLog *)ppSVar1,&local_7098);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7198,"TestImage",&local_7199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_71c0,"Test image",&local_71c1);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_71f0,(Surface *)&refSurface.m_pixels.m_cap);
    tcu::LogImage::LogImage
              (&local_7178,&local_7198,&local_71c0,&local_71f0,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_7178);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_72a0,"ReferenceImage",&local_72a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_72c8,"Reference image",&local_72c9);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_72f8,(Surface *)local_64d8);
    tcu::LogImage::LogImage
              (&local_7280,&local_72a0,&local_72c8,&local_72f8,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_7280);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_73a8,"DifferenceMask",&local_73a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_73d0,"Difference mask",&local_73d1);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_7400,(Surface *)local_6b08);
    tcu::LogImage::LogImage
              (&local_7388,&local_73a8,&local_73d0,&local_7400,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_7388);
    pTVar4 = tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::TestLog::operator<<(&local_7058,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_7058,(char (*) [5])0x129c9b9);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_6b0c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])" faulty pixel(s).");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7058);
    tcu::LogImage::~LogImage(&local_7388);
    std::__cxx11::string::~string((string *)&local_73d0);
    std::allocator<char>::~allocator(&local_73d1);
    std::__cxx11::string::~string((string *)&local_73a8);
    std::allocator<char>::~allocator(&local_73a9);
    tcu::LogImage::~LogImage(&local_7280);
    std::__cxx11::string::~string((string *)&local_72c8);
    std::allocator<char>::~allocator(&local_72c9);
    std::__cxx11::string::~string((string *)&local_72a0);
    std::allocator<char>::~allocator(&local_72a1);
    tcu::LogImage::~LogImage(&local_7178);
    std::__cxx11::string::~string((string *)&local_71c0);
    std::allocator<char>::~allocator(&local_71c1);
    std::__cxx11::string::~string((string *)&local_7198);
    std::allocator<char>::~allocator(&local_7199);
    tcu::LogImageSet::~LogImageSet(&local_7098);
    std::__cxx11::string::~string((string *)&local_70e0);
    std::allocator<char>::~allocator(&local_70e1);
    std::__cxx11::string::~string((string *)&local_70b8);
    std::allocator<char>::~allocator(&local_70b9);
    tcu::TestContext::setTestResult
              ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface((Surface *)local_6b08);
  tcu::Surface::~Surface((Surface *)local_64d8);
  tcu::Surface::~Surface((Surface *)&refSurface.m_pixels.m_cap);
  sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_6430);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers
            ((ReferenceContextBuffers *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ReferenceContextLimits::~ReferenceContextLimits((ReferenceContextLimits *)local_1f8);
  sglr::GLContext::~GLContext((GLContext *)local_190);
  return;
}

Assistant:

void FillTest::testRender (void)
{
	using tcu::TestLog;

	const int						numSamples	= 1;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	render(glesContext);
	glesContext.readPixels(testSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	render(refContext);
	refContext.readPixels(refSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// check overdraw
	{
		bool				overdrawOk;
		tcu::Surface		outputImage(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

		log << TestLog::Message << "Checking for overdraw " << TestLog::EndMessage;
		overdrawOk = checkHalfFilledImageOverdraw(log, m_context.getRenderTarget(), testSurface.getAccess(), outputImage.getAccess());

		if (!overdrawOk)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("InvalidPixels", "Invalid pixels", outputImage.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got overdraw." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got overdraw");
		}
	}

	// compare & check missing pixels
	{
		const int			kernelRadius	= 1;
		tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		int					faultyPixels;

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;

		blitImageOnBlackSurface(refSurface.getAccess(), refSurface.getAccess()); // makes images look right in Candy

		faultyPixels = compareBlackNonBlackImages(log, testSurface.getAccess(), refSurface.getAccess(), diffMask.getAccess(), kernelRadius);

		if (faultyPixels > 0)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("ReferenceImage", "Reference image", refSurface.getAccess())
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}